

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADEC-CORE.cpp
# Opt level: O3

void checker(void)

{
  int *piVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint uVar13;
  undefined1 auVar12 [16];
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar18;
  uint uVar19;
  undefined1 auVar17 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  uVar7 = (ulong)size;
  if ((long)uVar7 < 1) {
    if (CE_P_P != 0) goto LAB_00115f0b;
LAB_00115a75:
    iVar4 = 0;
  }
  else {
    uVar3 = 0;
    iVar4 = 0;
    do {
      if ((P.super__Base_bitset<235UL>._M_w[uVar3 >> 6] >> (uVar3 & 0x3f) & 1) != 0) {
        lVar5 = (long)NAdjP[uVar3];
        if (NAdjP[uVar3] < NAdjP[uVar3 + 1]) {
          do {
            iVar4 = iVar4 + (uint)((P.super__Base_bitset<235UL>._M_w[(ulong)(long)NAdjB[lVar5] >> 6]
                                    >> ((long)NAdjB[lVar5] & 0x3fU) & 1) != 0);
            lVar5 = lVar5 + 1;
          } while (NAdjP[uVar3 + 1] != lVar5);
        }
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != uVar7);
    if (iVar4 >> 1 != CE_P_P) {
LAB_00115f0b:
      __assert_fail("re_CE_P_P == CE_P_P",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/chenxiaoyu233[P]k-defective/MADEC-CORE.cpp"
                    ,0x13b,"void checker()");
    }
    if (size < 1) goto LAB_00115a75;
    uVar3 = 0;
    iVar4 = 0;
    do {
      if ((Cp.super__Base_bitset<235UL>._M_w[uVar3 >> 6] >> (uVar3 & 0x3f) & 1) != 0) {
        lVar5 = (long)NAdjP[uVar3];
        if (NAdjP[uVar3] < NAdjP[uVar3 + 1]) {
          do {
            iVar4 = iVar4 + (uint)((P.super__Base_bitset<235UL>._M_w[(ulong)(long)NAdjB[lVar5] >> 6]
                                    >> ((long)NAdjB[lVar5] & 0x3fU) & 1) != 0);
            lVar5 = lVar5 + 1;
          } while (NAdjP[uVar3 + 1] != lVar5);
        }
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != uVar7);
  }
  if (iVar4 != CE_Cp_P) {
    __assert_fail("re_CE_Cp_P == CE_Cp_P",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/chenxiaoyu233[P]k-defective/MADEC-CORE.cpp"
                  ,0x141,"void checker()");
  }
  if (size < 1) {
    if (CE_Cp_Cp != 0) goto LAB_00115f49;
LAB_00115b72:
    iVar4 = 0;
  }
  else {
    uVar3 = 0;
    iVar4 = 0;
    do {
      if ((Cp.super__Base_bitset<235UL>._M_w[uVar3 >> 6] >> (uVar3 & 0x3f) & 1) != 0) {
        lVar5 = (long)NAdjP[uVar3];
        if (NAdjP[uVar3] < NAdjP[uVar3 + 1]) {
          do {
            iVar4 = iVar4 + (uint)((Cp.super__Base_bitset<235UL>._M_w
                                    [(ulong)(long)NAdjB[lVar5] >> 6] >> ((long)NAdjB[lVar5] & 0x3fU)
                                   & 1) != 0);
            lVar5 = lVar5 + 1;
          } while (NAdjP[uVar3 + 1] != lVar5);
        }
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != uVar7);
    if (iVar4 >> 1 != CE_Cp_Cp) {
LAB_00115f49:
      __assert_fail("re_CE_Cp_Cp == CE_Cp_Cp",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/chenxiaoyu233[P]k-defective/MADEC-CORE.cpp"
                    ,0x148,"void checker()");
    }
    if (size < 1) goto LAB_00115b72;
    uVar3 = 0;
    iVar4 = 0;
    do {
      if ((Cm.super__Base_bitset<235UL>._M_w[uVar3 >> 6] >> (uVar3 & 0x3f) & 1) != 0) {
        lVar5 = (long)NAdjP[uVar3];
        if (NAdjP[uVar3] < NAdjP[uVar3 + 1]) {
          do {
            iVar4 = iVar4 + (uint)((Cp.super__Base_bitset<235UL>._M_w
                                    [(ulong)(long)NAdjB[lVar5] >> 6] >> ((long)NAdjB[lVar5] & 0x3fU)
                                   & 1) != 0);
            lVar5 = lVar5 + 1;
          } while (NAdjP[uVar3 + 1] != lVar5);
        }
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != uVar7);
  }
  if (iVar4 != CE_Cm_Cp) {
    __assert_fail("re_CE_Cm_Cp == CE_Cm_Cp",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/chenxiaoyu233[P]k-defective/MADEC-CORE.cpp"
                  ,0x14e,"void checker()");
  }
  if (size < 1) {
    iVar4 = 0;
  }
  else {
    uVar3 = 0;
    iVar4 = 0;
    do {
      if ((Cm.super__Base_bitset<235UL>._M_w[uVar3 >> 6] >> (uVar3 & 0x3f) & 1) != 0) {
        lVar5 = (long)NAdjP[uVar3];
        if (NAdjP[uVar3] < NAdjP[uVar3 + 1]) {
          do {
            iVar4 = iVar4 + (uint)((Cm.super__Base_bitset<235UL>._M_w
                                    [(ulong)(long)NAdjB[lVar5] >> 6] >> ((long)NAdjB[lVar5] & 0x3fU)
                                   & 1) != 0);
            lVar5 = lVar5 + 1;
          } while (NAdjP[uVar3 + 1] != lVar5);
        }
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != uVar7);
    iVar4 = iVar4 >> 1;
  }
  if (iVar4 != CE_Cm_Cm) {
    __assert_fail("re_CE_Cm_Cm == CE_Cm_Cm",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/chenxiaoyu233[P]k-defective/MADEC-CORE.cpp"
                  ,0x155,"void checker()");
  }
  uVar3 = 0;
  uVar6 = 0;
  if (0 < size) {
    uVar6 = (ulong)(uint)size;
  }
  while (uVar3 != uVar6) {
    lVar5 = (long)AdjP[uVar3];
    iVar4 = 0;
    if (AdjP[uVar3] < AdjP[uVar3 + 1]) {
      iVar4 = 0;
      do {
        iVar2 = AdjB[lVar5];
        uVar8 = (ulong)(long)iVar2 >> 6;
        uVar16 = 1;
        if ((Cp.super__Base_bitset<235UL>._M_w[uVar8] >> ((long)iVar2 & 0x3fU) & 1) == 0) {
          uVar16 = (uint)((Cm.super__Base_bitset<235UL>._M_w[uVar8] & 1L << ((byte)iVar2 & 0x3f)) !=
                         0);
        }
        iVar4 = iVar4 + uVar16;
        lVar5 = lVar5 + 1;
      } while (AdjP[uVar3 + 1] != lVar5);
    }
    piVar1 = neiC + uVar3;
    uVar3 = uVar3 + 1;
    if (iVar4 != *piVar1) {
      __assert_fail("re_neiC == neiC[v]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/chenxiaoyu233[P]k-defective/MADEC-CORE.cpp"
                    ,0x15b,"void checker()");
    }
  }
  uVar3 = 0;
  while (uVar3 != uVar6) {
    lVar5 = (long)AdjP[uVar3];
    iVar4 = 0;
    if (AdjP[uVar3] < AdjP[uVar3 + 1]) {
      iVar4 = 0;
      do {
        iVar4 = iVar4 + (uint)((P.super__Base_bitset<235UL>._M_w[(ulong)(long)AdjB[lVar5] >> 6] >>
                                ((long)AdjB[lVar5] & 0x3fU) & 1) != 0);
        lVar5 = lVar5 + 1;
      } while (AdjP[uVar3 + 1] != lVar5);
    }
    piVar1 = neiP + uVar3;
    uVar3 = uVar3 + 1;
    if (iVar4 != *piVar1) {
      __assert_fail("re_neiP == neiP[v]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/chenxiaoyu233[P]k-defective/MADEC-CORE.cpp"
                    ,0x162,"void checker()");
    }
  }
  if (size < 1) {
    if (sizeC != 0) goto LAB_00115fa6;
  }
  else {
    uVar3 = 0;
    iVar4 = 0;
    do {
      uVar16 = 1;
      if ((Cm.super__Base_bitset<235UL>._M_w[uVar3 >> 6] >> (uVar3 & 0x3f) & 1) == 0) {
        uVar16 = (uint)((Cp.super__Base_bitset<235UL>._M_w[uVar3 >> 6] & 1L << ((byte)uVar3 & 0x3f))
                       != 0);
      }
      iVar4 = iVar4 + uVar16;
      uVar3 = uVar3 + 1;
    } while (uVar7 != uVar3);
    if (iVar4 != sizeC) {
LAB_00115fa6:
      __assert_fail("re_sizeC == sizeC",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/chenxiaoyu233[P]k-defective/MADEC-CORE.cpp"
                    ,0x168,"void checker()");
    }
    if (0 < size) {
      lVar5 = uVar7 - 1;
      auVar9._8_4_ = (int)lVar5;
      auVar9._0_8_ = lVar5;
      auVar9._12_4_ = (int)((ulong)lVar5 >> 0x20);
      uVar7 = 0;
      auVar9 = auVar9 ^ _DAT_001211f0;
      auVar10 = _DAT_001211e0;
      uVar16 = 0;
      uVar19 = 0;
      do {
        uVar18 = uVar19;
        uVar15 = uVar16;
        auVar12 = auVar10 ^ _DAT_001211f0;
        auVar11._0_4_ = -(uint)(auVar9._0_4_ < auVar12._0_4_);
        auVar11._4_4_ = -(uint)(auVar9._4_4_ < auVar12._4_4_);
        auVar11._8_4_ = -(uint)(auVar9._8_4_ < auVar12._8_4_);
        auVar11._12_4_ = -(uint)(auVar9._12_4_ < auVar12._12_4_);
        uVar13 = -(uint)(auVar12._4_4_ == auVar9._4_4_);
        uVar14 = -(uint)(auVar12._12_4_ == auVar9._12_4_);
        auVar12._4_4_ = uVar13;
        auVar12._0_4_ = uVar13;
        auVar12._8_4_ = uVar14;
        auVar12._12_4_ = uVar14;
        auVar17 = auVar12 & auVar11;
        auVar20._4_4_ = auVar11._4_4_;
        auVar20._0_4_ = auVar11._4_4_;
        auVar20._8_4_ = auVar11._12_4_;
        auVar20._12_4_ = auVar11._12_4_;
        auVar20 = auVar20 | auVar17;
        if ((~auVar20._0_4_ & 1) != 0) {
          auVar17._8_8_ = 0;
          auVar17._0_8_ = P.super__Base_bitset<235UL>._M_w[uVar7 >> 6];
        }
        if (((auVar20._8_2_ ^ 0xffff) & 1) != 0) {
          auVar17._8_8_ = P.super__Base_bitset<235UL>._M_w[uVar7 >> 6];
        }
        auVar12 = auVar10 & _DAT_00121210;
        auVar21._8_4_ = auVar12._8_4_;
        auVar21._12_4_ = auVar12._12_4_;
        auVar21._0_8_ = auVar12._8_8_;
        uVar3 = 1L << auVar12._0_8_ & auVar17._0_8_;
        uVar6 = 1L << auVar21._8_8_ & auVar17._8_8_;
        uVar16 = (uVar15 - ((int)uVar3 == 0 && (int)(uVar3 >> 0x20) == 0)) + 1;
        uVar19 = (uVar18 - ((int)uVar6 == 0 && (int)(uVar6 >> 0x20) == 0)) + 1;
        uVar7 = uVar7 + 2;
        lVar5 = auVar10._8_8_;
        auVar10._0_8_ = auVar10._0_8_ + 2;
        auVar10._8_8_ = lVar5 + 2;
      } while ((size + 1U & 0xfffffffe) != uVar7);
      uVar13 = auVar11._4_4_ | uVar13 & auVar11._0_4_;
      uVar14 = auVar11._12_4_ | uVar14 & auVar11._8_4_;
      iVar4 = (~uVar14 & uVar19 | uVar18 & uVar14) + (~uVar13 & uVar16 | uVar15 & uVar13);
      goto LAB_00115ef0;
    }
  }
  iVar4 = 0;
LAB_00115ef0:
  if (iVar4 != sizeP) {
    __assert_fail("re_sizeP == sizeP",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/chenxiaoyu233[P]k-defective/MADEC-CORE.cpp"
                  ,0x16d,"void checker()");
  }
  return;
}

Assistant:

void checker() {
    /* CE_P_P */
    int re_CE_P_P = 0;
    for (int v = 0; v < size; ++v) if (P[v])
        FOR_C_NP(v, u) re_CE_P_P += 1;
    re_CE_P_P >>= 1;
    assert(re_CE_P_P == CE_P_P);

    /* CE_Cp_P */
    int re_CE_Cp_P = 0;
    for (int v = 0; v < size; ++v)
        if (Cp[v]) FOR_C_NP(v, u) re_CE_Cp_P += 1;
    assert(re_CE_Cp_P == CE_Cp_P);

    /* CE_Cp_Cp */
    int re_CE_Cp_Cp = 0;
    for (int v = 0; v < size; ++v)
        if (Cp[v]) FOR_C_NA(v, u) if (Cp[u]) ++re_CE_Cp_Cp;
    re_CE_Cp_Cp >>= 1;
    assert(re_CE_Cp_Cp == CE_Cp_Cp);

    /* CE_Cm_Cp */
    int re_CE_Cm_Cp = 0;
    for (int v = 0; v < size; ++v)
        if (Cm[v]) FOR_C_NA(v, u) if (Cp[u]) ++re_CE_Cm_Cp;
    assert(re_CE_Cm_Cp == CE_Cm_Cp);

    /* CE_Cm_Cm */
    int re_CE_Cm_Cm = 0;
    for (int v = 0; v < size; ++v)
        if (Cm[v]) FOR_C_NA(v, u) if (Cm[u]) ++re_CE_Cm_Cm;
    re_CE_Cm_Cm >>= 1;
    assert(re_CE_Cm_Cm == CE_Cm_Cm);

    /* neiC */
    for (int v = 0; v < size; ++v) {
        int re_neiC = 0;
        FOR_NC(v, u) re_neiC += 1;
        assert(re_neiC == neiC[v]);
    }

    /* neiP */
    for (int v = 0; v < size; ++v) {
        int re_neiP = 0;
        FOR_NP(v, u) re_neiP += 1;
        assert(re_neiP == neiP[v]);
    }

    /* sizeC */
    int re_sizeC = 0;
    for (int v = 0; v < size; ++v) if(Cm[v] || Cp[v]) ++re_sizeC;
    assert(re_sizeC == sizeC);

    /* sizeP */
    int re_sizeP = 0;
    for (int v = 0; v < size; ++v) if (P[v]) ++re_sizeP;
    assert(re_sizeP == sizeP);
}